

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian64(CodedInputStream *this,uint64 *value)

{
  bool bVar1;
  int iVar2;
  uint8 *puVar3;
  uint64 *in_RSI;
  CodedInputStream *in_RDI;
  CodedInputStream *value_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  value_00 = in_RDI;
  iVar2 = BufferSize(in_RDI);
  if (iVar2 < 8) {
    bVar1 = ReadLittleEndian64Fallback
                      ((CodedInputStream *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (uint64 *)value_00);
  }
  else {
    puVar3 = ReadLittleEndian64FromArray(in_RDI->buffer_,in_RSI);
    in_RDI->buffer_ = puVar3;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

inline bool CodedInputStream::ReadLittleEndian64(uint64* value) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  if (PROTOBUF_PREDICT_TRUE(BufferSize() >= static_cast<int>(sizeof(*value)))) {
    buffer_ = ReadLittleEndian64FromArray(buffer_, value);
    return true;
  } else {
    return ReadLittleEndian64Fallback(value);
  }
#else
  return ReadLittleEndian64Fallback(value);
#endif
}